

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate-sve.c
# Opt level: O0

_Bool do_mov_z(DisasContext_conflict1 *s,int rd,int rn)

{
  _Bool _Var1;
  int rn_local;
  int rd_local;
  DisasContext_conflict1 *s_local;
  
  _Var1 = do_vector2_z(s,tcg_gen_gvec_mov_aarch64,0,rd,rn);
  return _Var1;
}

Assistant:

static bool do_mov_z(DisasContext *s, int rd, int rn)
{
    return do_vector2_z(s, tcg_gen_gvec_mov, 0, rd, rn);
}